

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_masked_sprite_16px_right(tgestate_t *state,uint8_t x)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  byte *pbVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  
  bVar8 = x & 3;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_left;
  lVar9 = 0;
  do {
    bVar12 = puVar2[lVar9 * 2];
    bVar13 = puVar2[lVar9 * 2 + 1];
    bVar17 = puVar3[lVar9 * 2];
    bVar7 = puVar3[lVar9 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar11 = (ulong)bVar12;
      uVar15 = (ulong)bVar17;
      bVar17 = state->reversed[bVar7];
      bVar7 = state->reversed[uVar15];
      bVar12 = state->reversed[bVar13];
      bVar13 = state->reversed[uVar11];
    }
    bVar10 = 0xff;
    bVar6 = bVar7;
    bVar16 = bVar17;
    if (bVar8 == 3) {
      bVar16 = bVar17 >> 1 | 0x80;
      bVar6 = bVar17 << 7 | bVar7 >> 1;
      bVar10 = bVar7 << 7 | 0x7f;
    }
    bVar7 = bVar6;
    bVar17 = bVar16;
    if ((bVar8 ^ 2) < 2) {
      bVar17 = bVar16 >> 1 | 0x80;
      bVar7 = bVar16 << 7 | bVar6 >> 1;
      bVar10 = bVar10 >> 1 | bVar6 << 7;
    }
    bVar16 = bVar7;
    bVar6 = bVar17;
    if (bVar8 != 0) {
      bVar6 = bVar17 >> 1 | 0x80;
      bVar16 = bVar17 << 7 | bVar7 >> 1;
      bVar10 = bVar10 >> 1 | bVar7 << 7;
    }
    if (bVar8 == 3) {
      bVar17 = bVar12 << 7;
      bVar12 = bVar12 >> 1;
      uVar11 = (ulong)(byte)(bVar13 << 7);
      bVar13 = bVar17 | bVar13 >> 1;
    }
    else {
      uVar11 = 0;
    }
    bVar17 = bVar12;
    bVar7 = bVar13;
    if ((bVar8 ^ 2) < 2) {
      bVar17 = bVar12 >> 1;
      bVar7 = bVar12 << 7 | bVar13 >> 1;
      uVar11 = (ulong)(byte)(bVar13 << 7 | (byte)(uVar11 >> 1));
    }
    bVar5 = (byte)uVar11;
    bVar13 = bVar17;
    bVar12 = bVar7;
    if (bVar8 != 0) {
      bVar13 = bVar17 >> 1;
      bVar12 = bVar17 << 7 | bVar7 >> 1;
      bVar5 = bVar7 << 7 | (byte)(uVar11 >> 1);
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar14 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_left_1 != '\0') {
      *pbVar14 = bVar13 & *pbVar4 | (bVar6 | ~*pbVar4) & *pbVar14;
    }
    if ((state->spriteplotter).enable_16_left_2 != '\0') {
      pbVar14[1] = bVar12 & pbVar4[1] | (bVar16 | ~pbVar4[1]) & pbVar14[1];
    }
    pbVar14 = pbVar14 + 2;
    if ((state->spriteplotter).enable_16_left_3 != '\0') {
      *pbVar14 = bVar5 & pbVar4[2] | (bVar10 | ~pbVar4[2]) & *pbVar14;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar14 + (long)state->columns + -2;
    lVar9 = lVar9 + 1;
  } while (uVar1 != (uint8_t)lVar9);
  return;
}

Assistant:

void plot_masked_sprite_16px_right(tgestate_t *state, uint8_t x)
{
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  assert(x < 4);

  ASSERT_MASK_BUF_PTR_VALID(state->foreground_mask_pointer);

  x = (~x & 3); /* jump table offset (on input, x is 0..3) */

  maskptr   = state->mask_pointer;
  bitmapptr = state->bitmap_pointer;

  assert(maskptr   != NULL);
  assert(bitmapptr != NULL);

  iters = state->spriteplotter.height_16_left; /* self modified by $E49D (setup_vischar_plotting) */
  assert(iters <= MASK_BUFFER_HEIGHT * 8);

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, 2);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (iters - 1) * state->columns + 2 - 1, 2);
  do
  {
    uint8_t bm0, bm1, bm2;       /* was D, E, C */
    uint8_t mask0, mask1, mask2; /* was D', E', C' */
    int     carry = 0;

    /* Load bitmap bytes into D,E. */
    bm0 = *bitmapptr++;
    bm1 = *bitmapptr++;

    /* Load mask bytes into D',E'. */
    mask0 = *maskptr++;
    mask1 = *maskptr++;

    if (state->sprite_index & sprite_FLAG_FLIP)
      flip_16_masked_pixels(state, &mask0, &mask1, &bm0, &bm1);

    foremaskptr = state->foreground_mask_pointer;
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* In the 24 pixel-wide plotter it does bitmap rotates THEN mask rotates.
     * Is this the opposite way around to save a bank switch? */

    /* Shift mask bytes */

    mask2 = 0xFF; /* all bits set => mask off */
    carry = 1; /* mask off */
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }
    if (x <= 1)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }
    if (x <= 2)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }

    /* Shift bitmap bytes */

    bm2 = 0; /* all bits clear => pixels off */
    //carry = 0; in original code but never read in practice
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }
    if (x <= 1)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }
    if (x <= 2)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }

    /* Plot, using foreground mask. */

    screenptr = state->window_buf_pointer; // line moved relative to the 24 version
    ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Conv: We form 'mask' inside of the enable_* condition. The original
     * game got away with accessing out-of-bounds memory but we can't. */

    if (state->spriteplotter.enable_16_left_1)
      *screenptr = MASK(bm0, mask0);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_left_2)
      *screenptr = MASK(bm1, mask1);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_left_3)
      *screenptr = MASK(bm2, mask2);
    foremaskptr += 2;
    state->foreground_mask_pointer = foremaskptr;

    screenptr += state->columns - 2; /* was 22 */
    if (iters > 1)
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    state->window_buf_pointer = screenptr;
  }
  while (--iters);
}